

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testProperties(tst_InsertProxyModel *this)

{
  byte bVar1;
  bool bVar2;
  ModelTest *this_00;
  QFlags<InsertProxyModel::InsertDirection> *value;
  bool local_d9;
  QVariant local_d8;
  bool local_b1;
  QVariant local_b0;
  QFlags<InsertProxyModel::InsertDirection> local_8c;
  QVariant local_88;
  QFlags<InsertProxyModel::InsertDirection> local_64;
  undefined4 local_60;
  undefined1 local_5c [52];
  InsertProxyModel local_28 [8];
  InsertProxyModel proxyModel;
  tst_InsertProxyModel *this_local;
  
  InsertProxyModel::InsertProxyModel(local_28,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_28,&this->super_QObject);
  local_5c._0_4_ = operator|(InsertColumn,InsertRow);
  QVariant::fromValue<QFlags<InsertProxyModel::InsertDirection>>
            ((enable_if_t<std::is_copy_constructible_v<QFlags<InsertProxyModel::InsertDirection>_>,_QVariant>
              *)(local_5c + 4),(QVariant *)local_5c,value);
  bVar1 = QObject::setProperty((char *)local_28,(QVariant *)"insertDirection");
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                         "proxyModel.setProperty(\"insertDirection\", QVariant::fromValue(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow))"
                         ,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,499);
  QVariant::~QVariant((QVariant *)(local_5c + 4));
  if (((bVar1 ^ 0xff) & 1) == 0) {
    QObject::property((char *)&local_88);
    local_64 = QVariant::value<QFlags<InsertProxyModel::InsertDirection>>(&local_88);
    local_8c = operator|(InsertColumn,InsertRow);
    bVar2 = QTest::
            qCompare<QFlags<InsertProxyModel::InsertDirection>,QFlags<InsertProxyModel::InsertDirection>>
                      (&local_64,&local_8c,
                       "proxyModel.property(\"insertDirection\").value<InsertProxyModel::InsertDirections>()"
                       ,"InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                       ,0x1f5);
    QVariant::~QVariant(&local_88);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      QVariant::QVariant(&local_b0,false);
      bVar1 = QObject::setProperty((char *)local_28,(QVariant *)"mergeDisplayEdit");
      bVar1 = QTest::qVerify((bool)(bVar1 & 1),"proxyModel.setProperty(\"mergeDisplayEdit\", false)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x1f6);
      QVariant::~QVariant(&local_b0);
      if (((bVar1 ^ 0xff) & 1) == 0) {
        QObject::property((char *)&local_d8);
        bVar1 = QVariant::toBool();
        local_b1 = (bool)(bVar1 & 1);
        local_d9 = false;
        bVar2 = QTest::qCompare<bool,bool>
                          (&local_b1,&local_d9,"proxyModel.property(\"mergeDisplayEdit\").toBool()",
                           "false",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x1f7);
        QVariant::~QVariant(&local_d8);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_60 = 0;
        }
        else {
          local_60 = 1;
        }
      }
      else {
        local_60 = 1;
      }
    }
    else {
      local_60 = 1;
    }
  }
  else {
    local_60 = 1;
  }
  InsertProxyModel::~InsertProxyModel(local_28);
  return;
}

Assistant:

void tst_InsertProxyModel::testProperties()
{
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    QVERIFY(proxyModel.setProperty("insertDirection", QVariant::fromValue(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow)));
    QCOMPARE(proxyModel.property("insertDirection").value<InsertProxyModel::InsertDirections>(),
             InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    QVERIFY(proxyModel.setProperty("mergeDisplayEdit", false));
    QCOMPARE(proxyModel.property("mergeDisplayEdit").toBool(), false);
}